

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O2

void ctemplate::StringToFile(string *s,string *filename)

{
  long lVar1;
  FILE *__s;
  size_t sVar2;
  utimbuf timbuf;
  
  __s = fopen((filename->_M_dataplus)._M_p,"wb");
  if (__s == (FILE *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x80,"fp");
    __assert_fail("fp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_test_util.cc"
                  ,0x80,"void ctemplate::StringToFile(const string &, const string &)");
  }
  sVar2 = fwrite((s->_M_dataplus)._M_p,1,s->_M_string_length,__s);
  if (sVar2 == s->_M_string_length) {
    fclose(__s);
    Mutex::Lock((Mutex *)g_time_mutex);
    lVar1 = mock_time;
    mock_time = mock_time + 1;
    Mutex::Unlock((Mutex *)g_time_mutex);
    timbuf.actime = lVar1;
    timbuf.modtime = lVar1;
    utime((filename->_M_dataplus)._M_p,(utimbuf *)&timbuf);
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0x82,"r == s.length()");
  if (sVar2 == s->_M_string_length) {
    exit(1);
  }
  __assert_fail("r == s.length()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_test_util.cc"
                ,0x82,"void ctemplate::StringToFile(const string &, const string &)");
}

Assistant:

void StringToFile(const string& s, const string& filename) {
  FILE* fp = fopen(filename.c_str(), "wb");
  ASSERT(fp);
  size_t r = fwrite(s.data(), 1, s.length(), fp);
  ASSERT(r == s.length());
  fclose(fp);

  g_time_mutex.Lock();
  const time_t file_time = mock_time++;
  g_time_mutex.Unlock();
  struct utimbuf timbuf = { file_time, file_time };
  utime(filename.c_str(), &timbuf);
}